

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

int nn_sws_send(nn_pipebase *self,nn_msg *msg)

{
  nn_msg *self_00;
  nn_chunkref *self_01;
  byte bVar1;
  nn_cmsghdr *pnVar2;
  nn_cmsghdr *cmsg;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  int *piVar8;
  uint8_t rand_mask [4];
  nn_msghdr msghdr;
  nn_iovec iov [3];
  undefined4 local_8c;
  nn_msghdr local_88;
  nn_iovec local_68;
  void *local_58;
  size_t local_50;
  void *local_48;
  size_t local_40;
  
  piVar8 = &self[-0x1a].out.type;
  if (self == (nn_pipebase *)0x0) {
    piVar8 = (int *)0x0;
  }
  if (piVar8[0x16] == 4) {
    if (piVar8[0x5e8] == 1) {
      self_00 = (nn_msg *)(piVar8 + 0x5ee);
      nn_msg_term(self_00);
      nn_msg_mv(self_00,msg);
      cmsg = (nn_cmsghdr *)0x0;
      *(undefined8 *)((long)piVar8 + 0x17aa) = 0;
      *(undefined8 *)(piVar8 + 0x5e9) = 0;
      local_88.msg_iov = (nn_iovec *)0x0;
      local_88.msg_iovlen = 0;
      local_88.msg_controllen = nn_chunkref_size((nn_chunkref *)(piVar8 + 0x5f6));
      if (local_88.msg_controllen != 0) {
        local_88.msg_control = nn_chunkref_data((nn_chunkref *)(piVar8 + 0x5f6));
        cmsg = (nn_cmsghdr *)0x0;
        pnVar2 = nn_cmsg_nxthdr_(&local_88,(nn_cmsghdr *)0x0);
        if (pnVar2 != (nn_cmsghdr *)0x0) {
          cmsg = pnVar2;
          do {
            if ((cmsg->cmsg_level == -4) && (cmsg->cmsg_type == 1)) goto LAB_0015c80b;
            cmsg = nn_cmsg_nxthdr_(&local_88,cmsg);
          } while (cmsg != (nn_cmsghdr *)0x0);
          cmsg = (nn_cmsghdr *)0x0;
        }
      }
LAB_0015c80b:
      pnVar2 = cmsg + 1;
      if (cmsg == (nn_cmsghdr *)0x0) {
        pnVar2 = (nn_cmsghdr *)(piVar8 + 0x17);
      }
      *(byte *)(piVar8 + 0x5e9) = (byte)pnVar2->cmsg_len | 0x80;
      sVar3 = nn_chunkref_size((nn_chunkref *)self_00);
      self_01 = (nn_chunkref *)(piVar8 + 0x5fe);
      sVar4 = nn_chunkref_size(self_01);
      uVar5 = sVar4 + sVar3;
      bVar1 = *(byte *)((long)piVar8 + 0x17a5);
      if (uVar5 < 0x7e) {
        *(byte *)((long)piVar8 + 0x17a5) = bVar1 | (byte)uVar5;
        sVar3 = 2;
      }
      else if (uVar5 < 0x10000) {
        *(byte *)((long)piVar8 + 0x17a5) = bVar1 | 0x7e;
        nn_puts((uint8_t *)((long)piVar8 + 0x17a6),(uint16_t)uVar5);
        sVar3 = 4;
      }
      else {
        *(byte *)((long)piVar8 + 0x17a5) = bVar1 | 0x7f;
        nn_putll((uint8_t *)((long)piVar8 + 0x17a6),uVar5);
        sVar3 = 10;
      }
      if (piVar8[0x18] == 2) {
LAB_0015c940:
        local_68.iov_base = piVar8 + 0x5e9;
        local_68.iov_len = sVar3;
        local_58 = nn_chunkref_data((nn_chunkref *)self_00);
        local_50 = nn_chunkref_size((nn_chunkref *)self_00);
        local_48 = nn_chunkref_data(self_01);
        local_40 = nn_chunkref_size(self_01);
        nn_usock_send(*(nn_usock **)(piVar8 + 0x1a),&local_68,3);
        piVar8[0x5e8] = 2;
        return 0;
      }
      if (piVar8[0x18] == 1) {
        *(byte *)((long)piVar8 + 0x17a5) = *(byte *)((long)piVar8 + 0x17a5) | 0x80;
        nn_random_generate(&local_8c,4);
        *(undefined4 *)((long)piVar8 + sVar3 + 0x17a4) = local_8c;
        pvVar6 = nn_chunkref_data((nn_chunkref *)self_00);
        sVar4 = nn_chunkref_size((nn_chunkref *)self_00);
        uVar5 = 0;
        if (sVar4 != 0) {
          do {
            *(byte *)((long)pvVar6 + uVar5) =
                 *(byte *)((long)pvVar6 + uVar5) ^
                 *(byte *)((long)&local_8c + (ulong)((uint)uVar5 & 3));
            uVar5 = uVar5 + 1;
          } while ((uVar5 & 0xffffffff) < sVar4);
        }
        sVar3 = sVar3 + 4;
        pvVar6 = nn_chunkref_data(self_01);
        sVar4 = nn_chunkref_size(self_01);
        if (sVar4 != 0) {
          uVar7 = 0;
          do {
            *(byte *)((long)pvVar6 + uVar7) =
                 *(byte *)((long)pvVar6 + uVar7) ^
                 *(byte *)((long)&local_8c + (ulong)((int)uVar5 + (int)uVar7 & 3));
            uVar7 = uVar7 + 1;
          } while ((uVar7 & 0xffffffff) < sVar4);
        }
        goto LAB_0015c940;
      }
      goto LAB_0015c9c6;
    }
  }
  else {
    nn_sws_send_cold_1();
  }
  nn_sws_send_cold_2();
LAB_0015c9c6:
  nn_sws_send_cold_3();
}

Assistant:

static int nn_sws_send (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sws *sws;
    struct nn_iovec iov [3];
    int mask_pos;
    size_t nn_msg_size;
    size_t hdr_len;
    struct nn_cmsghdr *cmsg;
    struct nn_msghdr msghdr;
    uint8_t rand_mask [NN_SWS_FRAME_SIZE_MASK];

    sws = nn_cont (self, struct nn_sws, pipebase);

    nn_assert_state (sws, NN_SWS_STATE_ACTIVE);
    nn_assert (sws->outstate == NN_SWS_OUTSTATE_IDLE);

    /*  Move the message to the local storage. */
    nn_msg_term (&sws->outmsg);
    nn_msg_mv (&sws->outmsg, msg);

    memset (sws->outhdr, 0, sizeof (sws->outhdr));

    hdr_len = NN_SWS_FRAME_SIZE_INITIAL;

    cmsg = NULL;
    msghdr.msg_iov = NULL;
    msghdr.msg_iovlen = 0;
    msghdr.msg_controllen = nn_chunkref_size (&sws->outmsg.hdrs);

    /*  If the outgoing message has specified an opcode and control framing in
        its header, properly frame it as per RFC 6455 5.2. */
    if (msghdr.msg_controllen > 0) {
        msghdr.msg_control = nn_chunkref_data (&sws->outmsg.hdrs);
        cmsg = NN_CMSG_FIRSTHDR (&msghdr);
        while (cmsg) {
            if (cmsg->cmsg_level == NN_WS && cmsg->cmsg_type == NN_WS_MSG_TYPE)
                break;
            cmsg = NN_CMSG_NXTHDR (&msghdr, cmsg);
        }
    }

    /*  If the header does not specify an opcode, take default from option. */
    if (cmsg)
        sws->outhdr [0] = *(uint8_t *) NN_CMSG_DATA (cmsg);
    else
        sws->outhdr [0] = sws->msg_type;

    /*  For now, enforce that outgoing messages are the final frame. */
    sws->outhdr [0] |= NN_SWS_FRAME_BITMASK_FIN;

    nn_msg_size = nn_chunkref_size (&sws->outmsg.sphdr) +
        nn_chunkref_size (&sws->outmsg.body);

    /*  Framing WebSocket payload size in network byte order (big endian). */
    if (nn_msg_size <= NN_SWS_PAYLOAD_MAX_LENGTH) {
        sws->outhdr [1] |= (uint8_t) nn_msg_size;
        hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_0;
    }
    else if (nn_msg_size <= NN_SWS_PAYLOAD_MAX_LENGTH_16) {
        sws->outhdr [1] |= NN_SWS_PAYLOAD_FRAME_16;
        nn_puts (&sws->outhdr [hdr_len], (uint16_t) nn_msg_size);
        hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_16;
    }
    else {
        sws->outhdr [1] |= NN_SWS_PAYLOAD_FRAME_63;
        nn_putll (&sws->outhdr [hdr_len], (uint64_t) nn_msg_size);
        hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_63;
    }

    if (sws->mode == NN_WS_CLIENT) {
        sws->outhdr [1] |= NN_SWS_FRAME_BITMASK_MASKED;

        /*  Generate 32-bit mask as per RFC 6455 5.3. */
        nn_random_generate (rand_mask, NN_SWS_FRAME_SIZE_MASK);

        memcpy (&sws->outhdr [hdr_len], rand_mask, NN_SWS_FRAME_SIZE_MASK);
        hdr_len += NN_SWS_FRAME_SIZE_MASK;

        /*  Mask payload, beginning with header and moving to body. */
        mask_pos = 0;

        nn_sws_mask_payload (nn_chunkref_data (&sws->outmsg.sphdr),
            nn_chunkref_size (&sws->outmsg.sphdr),
            rand_mask, NN_SWS_FRAME_SIZE_MASK, &mask_pos);

        nn_sws_mask_payload (nn_chunkref_data (&sws->outmsg.body),
            nn_chunkref_size (&sws->outmsg.body),
            rand_mask, NN_SWS_FRAME_SIZE_MASK, &mask_pos);

    }
    else if (sws->mode == NN_WS_SERVER) {
        sws->outhdr [1] |= NN_SWS_FRAME_BITMASK_NOT_MASKED;
    }
    else {
        /*  Developer error; sws object was not constructed properly. */
        nn_assert (0);
    }

    /*  Start async sending. */
    iov [0].iov_base = sws->outhdr;
    iov [0].iov_len = hdr_len;
    iov [1].iov_base = nn_chunkref_data (&sws->outmsg.sphdr);
    iov [1].iov_len = nn_chunkref_size (&sws->outmsg.sphdr);
    iov [2].iov_base = nn_chunkref_data (&sws->outmsg.body);
    iov [2].iov_len = nn_chunkref_size (&sws->outmsg.body);
    nn_usock_send (sws->usock, iov, 3);

    sws->outstate = NN_SWS_OUTSTATE_SENDING;

    return 0;
}